

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O3

ngx_int_t ngx_chain_add_copy(ngx_pool_t *pool,ngx_chain_t **chain,ngx_chain_t *in)

{
  ngx_chain_t *pnVar1;
  ngx_chain_t **ppnVar2;
  
  do {
    ppnVar2 = chain;
    chain = &(*ppnVar2)->next;
  } while (*ppnVar2 != (ngx_chain_t *)0x0);
  if (in != (ngx_chain_t *)0x0) {
    do {
      pnVar1 = pool->chain;
      if (pnVar1 == (ngx_chain_t *)0x0) {
        pnVar1 = (ngx_chain_t *)ngx_palloc(pool,0x10);
        if (pnVar1 == (ngx_chain_t *)0x0) {
          return -1;
        }
      }
      else {
        pool->chain = pnVar1->next;
      }
      pnVar1->buf = in->buf;
      *ppnVar2 = pnVar1;
      ppnVar2 = &pnVar1->next;
      in = in->next;
    } while (in != (ngx_chain_t *)0x0);
  }
  *ppnVar2 = (ngx_chain_t *)0x0;
  return 0;
}

Assistant:

ngx_int_t
ngx_chain_add_copy(ngx_pool_t *pool, ngx_chain_t **chain, ngx_chain_t *in)
{
    ngx_chain_t  *cl, **ll;

    ll = chain;

    for (cl = *chain; cl; cl = cl->next) {
        ll = &cl->next;
    }

    while (in) {
        cl = ngx_alloc_chain_link(pool);
        if (cl == NULL) {
            return NGX_ERROR;
        }

        cl->buf = in->buf;
        *ll = cl;
        ll = &cl->next;
        in = in->next;
    }

    *ll = NULL;

    return NGX_OK;
}